

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

string * google::protobuf::compiler::cpp::anon_unknown_5::ReinterpretCast
                   (string *__return_storage_ptr__,string *type,string *expression,
                   bool implicit_weak_field)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_21;
  string *psStack_20;
  bool implicit_weak_field_local;
  string *expression_local;
  string *type_local;
  
  local_21 = implicit_weak_field;
  psStack_20 = expression;
  expression_local = type;
  type_local = __return_storage_ptr__;
  if (implicit_weak_field) {
    std::operator+(&local_88,"reinterpret_cast< ",type);
    std::operator+(&local_68,&local_88," >(");
    std::operator+(&local_48,&local_68,psStack_20);
    std::operator+(__return_storage_ptr__,&local_48,")");
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)expression);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ReinterpretCast(const std::string& type,
                            const std::string& expression,
                            bool implicit_weak_field) {
  if (implicit_weak_field) {
    return "reinterpret_cast< " + type + " >(" + expression + ")";
  } else {
    return expression;
  }
}